

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitCall(ParseNodeCall *pnodeCall,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
             BOOL fReturnValue,BOOL fEvaluateComponents,RegSlot overrideThisLocation,
             RegSlot newTargetLocation)

{
  undefined1 *puVar1;
  ParseNode *pnode;
  ParseableFunctionInfo *pPVar2;
  code *pcVar3;
  BOOL BVar4;
  ArgSlot argsCountForStartCall;
  byte bVar5;
  uint16 uVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  RegSlot thisLocation_00;
  uint16 uVar10;
  uint argCount;
  bool bVar11;
  AuxArray<unsigned_int> *local_80;
  AuxArray<unsigned_int> *spreadIndices;
  BOOL local_70;
  BOOL fSideEffectArgs;
  ulong local_68;
  uint16 local_5e;
  uint local_5c;
  ByteCodeGenerator *local_58;
  ParseNodeCall *local_50;
  RegSlot local_44;
  RegSlot local_40;
  RegSlot thisLocation;
  RegSlot callObjLocation;
  uint16 local_34;
  bool local_31 [3];
  ProfileId callApplyCallSiteId;
  ProfileId callSiteId;
  bool releaseThisLocation;
  
  local_50 = (ParseNodeCall *)CONCAT44(local_50._4_4_,overrideThisLocation);
  local_44 = 0xffffffff;
  local_40 = 0xffffffff;
  bVar11 = newTargetLocation != 0xffffffff;
  spreadIndices._4_4_ = 0;
  local_68 = CONCAT71(local_68._1_7_,pnodeCall->field_0x24);
  local_58 = (ByteCodeGenerator *)pnodeCall->pnodeTarget;
  pnode = pnodeCall->pnodeArgs;
  local_5e = pnodeCall->spreadArgCount;
  local_70 = fEvaluateComponents;
  thisLocation = fReturnValue;
  bVar7 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  if (bVar7) {
    CallTargetIsArray((ParseNode *)local_58);
  }
  uVar8 = CountArguments(pnode,(BOOL *)((long)&spreadIndices + 4));
  local_5c = *(uint *)&pnodeCall->field_0x24 >> 2 & 1;
  callObjLocation._1_1_ = bVar11;
  if (local_5c != 0) {
    if (newTargetLocation != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x214d,"(!fHasNewTarget)","!fHasNewTarget");
      if (!bVar7) goto LAB_0081104f;
      *puVar9 = 0;
    }
    bVar11 = 1 < uVar8;
  }
  argCount = bVar11 + uVar8;
  fSideEffectArgs = uVar8 & 0xffff;
  if (argCount < (uint)fSideEffectArgs) {
    Js::Throw::OutOfMemory();
  }
  if (thisLocation != 0) {
    puVar1 = &(pnodeCall->super_ParseNode).field_0x1;
    *puVar1 = *puVar1 | 1;
  }
  local_31[0] = true;
  callObjLocation._2_2_ = -1;
  if ((local_68 & 8) == 0) {
    if (local_70 == 0) {
      EmitCallTargetNoEvalComponents
                ((ParseNode *)local_58,argCount,&local_44,local_31,&local_40,byteCodeGenerator,
                 funcInfo);
    }
    else {
      EmitCallTarget((ParseNode *)local_58,spreadIndices._4_4_,&local_44,local_31,&local_40,
                     byteCodeGenerator,funcInfo,(ProfileId *)((long)&callObjLocation + 2));
    }
  }
  if ((RegSlot)local_50 != 0xffffffff) {
    local_31[0] = false;
    local_44 = (RegSlot)local_50;
  }
  thisLocation = argCount;
  FuncInfo::StartRecordingOutArgs(funcInfo,argCount);
  bVar7 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(&byteCodeGenerator->m_writer,CallI);
  if ((bVar7) && (local_34 = byteCodeGenerator->m_callSiteId, local_34 != 0xffff)) {
    byteCodeGenerator->m_callSiteId = local_34 + 1;
  }
  else {
    local_34 = byteCodeGenerator->m_callSiteId;
  }
  local_50 = pnodeCall;
  if (callObjLocation._2_2_ != -1) {
    JsUtil::
    BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)funcInfo->callSiteToCallApplyCallSiteMap,&local_34,
               (unsigned_short *)((long)&callObjLocation + 2));
  }
  uVar6 = local_34;
  uVar8 = local_5c;
  uVar10 = byteCodeGenerator->m_callSiteId;
  bVar7 = true;
  local_58 = byteCodeGenerator;
  if ((local_50->field_0x24 & 0x10) == 0) {
    pPVar2 = funcInfo->byteCodeFunction;
    local_68 = CONCAT62(local_68._2_6_,uVar10);
    if ((pPVar2->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar7) goto LAB_0081104f;
      *puVar9 = 0;
      uVar10 = (uint16)local_68;
    }
    if ((ParseableFunctionInfo *)
        (((pPVar2->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar7) {
LAB_0081104f:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
      uVar10 = (uint16)local_68;
    }
    if ((((pPVar2->super_FunctionProxy).functionInfo.ptr)->attributes & (Async|Generator)) == None)
    {
      bVar7 = false;
    }
    else {
      bVar7 = local_50->pnodeArgs != (ParseNodePtr)0x0;
    }
  }
  bVar5 = callObjLocation._1_1_;
  BVar4 = local_70;
  local_68 = (ulong)local_34;
  argsCountForStartCall = (ArgSlot)thisLocation;
  thisLocation = local_44;
  EmitArgList(pnode,local_44,newTargetLocation,uVar8,local_70,local_58,funcInfo,local_34,
              argsCountForStartCall,bVar7,uVar6 != uVar10,local_5e,&local_80);
  if (BVar4 == 0) {
    EmitCallInstrNoEvalComponents
              (local_50,local_5c,(uint)bVar5,thisLocation,local_40,fSideEffectArgs,local_58,funcInfo
               ,local_34,local_80);
  }
  else {
    thisLocation_00 = 0xffffffff;
    if (local_31[0] != false) {
      thisLocation_00 = thisLocation;
    }
    EmitCallInstr(local_50,local_5c,(uint)bVar5,thisLocation_00,local_40,fSideEffectArgs,local_58,
                  funcInfo,local_34,local_80);
  }
  FuncInfo::EndRecordingOutArgs(funcInfo,argsCountForStartCall);
  return;
}

Assistant:

void EmitCall(
    ParseNodeCall * pnodeCall,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    BOOL fReturnValue,
    BOOL fEvaluateComponents,
    Js::RegSlot overrideThisLocation,
    Js::RegSlot newTargetLocation)
{
    // If the call returns a float, we'll note this in the byte code.
    Js::RegSlot thisLocation = Js::Constants::NoRegister;
    Js::RegSlot callObjLocation = Js::Constants::NoRegister;
    BOOL fHasNewTarget = newTargetLocation != Js::Constants::NoRegister;
    BOOL fSideEffectArgs = FALSE;
    BOOL fIsSuperCall = pnodeCall->isSuperCall;
    ParseNode *pnodeTarget = pnodeCall->pnodeTarget;
    ParseNode *pnodeArgs = pnodeCall->pnodeArgs;
    uint16 spreadArgCount = pnodeCall->spreadArgCount;

    if (CreateNativeArrays(byteCodeGenerator, funcInfo) && CallTargetIsArray(pnodeTarget)) {
        // some minifiers (potentially incorrectly) assume that "v = new Array()" and "v = Array()" are equivalent,
        // and replace the former with the latter to save 4 characters. What that means for us is that it, at least
        // initially, uses the "Call" path. We want to guess that it _is_ just "new Array()" and change over to the
        // "new" path, since then our native array handling can kick in.
        /*EmitNew(pnode, byteCodeGenerator, funcInfo);
        return;*/
    }

    unsigned int argCount = CountArguments(pnodeArgs, &fSideEffectArgs);

    BOOL fIsEval = pnodeCall->isEvalCall;
    Js::ArgSlot argSlotCount = (Js::ArgSlot)argCount;

    if (fIsEval)
    {
        Assert(!fHasNewTarget);

        //
        // "eval" takes the closure environment as an extra argument
        // Pass the closure env only if some argument is passed
        // For just eval(), don't pass the closure environment
        //
        if (argCount > 1)
        {
            argCount++;
        }
    }
    else if (fHasNewTarget)
    {
        // When we need to pass new.target explicitly, it is passed as an extra argument.
        // This is similar to how eval passes an extra argument for the frame display and is
        // used to support cases where we need to pass both 'this' and new.target as part of
        // a function call.
        // OpCode::LdNewTarget knows how to look at the call flags and fetch this argument.
        argCount++;
    }

    // argCount indicates the total arguments count including the extra arguments.
    // argSlotCount indicates the actual arguments count. So argCount should always never be les sthan argSlotCount.
    if (argCount < (unsigned int)argSlotCount)
    {
        Js::Throw::OutOfMemory();
    }

    if (fReturnValue)
    {
        pnodeCall->isUsed = true;
    }

    //
    // Set up the call.
    //

    bool releaseThisLocation = true;

    // We already emit the call target for super calls in EmitSuperCall
    Js::ProfileId callApplyCallSiteId = Js::Constants::NoProfileId;
    if (!fIsSuperCall)
    {
        if (!fEvaluateComponents)
        {
            EmitCallTargetNoEvalComponents(pnodeTarget, fSideEffectArgs, &thisLocation, &releaseThisLocation, &callObjLocation, byteCodeGenerator, funcInfo);
        }
        else
        {
            EmitCallTarget(pnodeTarget, fSideEffectArgs, &thisLocation, &releaseThisLocation, &callObjLocation, byteCodeGenerator, funcInfo, &callApplyCallSiteId);
        }
    }

    // If we are strictly overriding the this location, ignore what the call target set this location to.
    if (overrideThisLocation != Js::Constants::NoRegister)
    {
        thisLocation = overrideThisLocation;
        releaseThisLocation = false;
    }

    // Evaluate the arguments (nothing mode-specific here).
    // Start call, allocate out param space
    // We have to use the arguments count including the extra args to Start Call as we use it to allocated space for all the args
    funcInfo->StartRecordingOutArgs(argCount);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);
    if (callApplyCallSiteId != Js::Constants::NoProfileId)
    {
        funcInfo->callSiteToCallApplyCallSiteMap->AddNew(callSiteId, callApplyCallSiteId);
    }

    // Only emit profiled argouts if we're going to allocate callSiteInfo (on the DynamicProfileInfo) for this call.
    bool emitProfiledArgouts = callSiteId != byteCodeGenerator->GetCurrentCallSiteId();

    // Emit argouts at end for generators so that we don't need to restore them when bailing in
    bool emitArgOutsAtEnd = pnodeCall->hasDestructuring || (funcInfo->byteCodeFunction->IsCoroutine() && pnodeCall->pnodeArgs != nullptr);
    Js::AuxArray<uint32> *spreadIndices;
    EmitArgList(pnodeArgs, thisLocation, newTargetLocation, fIsEval, fEvaluateComponents, byteCodeGenerator, funcInfo, callSiteId, (Js::ArgSlot)argCount, emitArgOutsAtEnd, emitProfiledArgouts, spreadArgCount, &spreadIndices);

    if (!fEvaluateComponents)
    {
        EmitCallInstrNoEvalComponents(pnodeCall, fIsEval, fHasNewTarget, thisLocation, callObjLocation, argSlotCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }
    else
    {
        EmitCallInstr(pnodeCall, fIsEval, fHasNewTarget, releaseThisLocation ? thisLocation : Js::Constants::NoRegister, callObjLocation, argSlotCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }

    // End call, pop param space
    funcInfo->EndRecordingOutArgs((Js::ArgSlot)argCount);
}